

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

int get_physical_address_wtlb
              (CPUPPCState_conflict2 *env,mmu_ctx_t_conflict *ctx,target_ulong eaddr,int rw,
              int access_type,int mmu_idx)

{
  CPUPPCState_conflict2 *env_00;
  byte bVar1;
  ppcemb_tlb_t_conflict2 *ppVar2;
  ulong uVar3;
  sbyte sVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ppcmas_tlb_t *tlb;
  long lVar10;
  uint *puVar11;
  ppc6xx_tlb_t_conflict2 *ppVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  char *fmt;
  uint uVar17;
  ulong uVar18;
  target_ulong tVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  CPUPPCState_conflict2 *__mptr;
  mmu_ctx_t_conflict *pmVar24;
  _Bool local_62;
  _Bool as;
  ppcemb_tlb_t_conflict2 local_60;
  uint local_38;
  uint32_t epid;
  
  uVar16 = (ulong)(uint)mmu_idx;
  local_60.size = CONCAT44(local_60.size._4_4_,mmu_idx);
  lVar10 = 0;
  puVar11 = (uint *)CONCAT71((int7)(eaddr >> 8),access_type == 0x10);
  if (env->mmu_model - POWERPC_MMU_SOFT_6xx < 8) {
    local_60.PID = env->msr;
    lVar10 = (ulong)(access_type == 0x10) * 0x10 + 0x10;
    puVar11 = &switchD_009e31f6::switchdataD_00bc15ec;
    uVar17 = (uint)lVar10;
    uVar8 = (uint)local_60.PID;
    uVar21 = 4;
    local_60.EPN._4_4_ = rw;
    switch(env->mmu_model) {
    default:
      if ((uVar8 & uVar17) != 0) {
        uVar17 = (uint)eaddr;
        if ((ulong)env->nb_BATs != 0) {
          uVar16 = (ulong)(access_type == 0x10);
          for (uVar18 = 0; env->nb_BATs != uVar18; uVar18 = uVar18 + 1) {
            uVar23 = env->DBAT[(ulong)(access_type == 0x10) * 2][uVar18];
            uVar13 = (uint)uVar23;
            if (((uVar8 >> 0xe & 1) == 0) && ((uVar23 & 2) != 0)) {
LAB_009e3279:
              bVar1 = 1;
              uVar20 = (uint)env->DBAT[uVar16 * 2 + 1][uVar18] & 3;
              if (uVar20 != 0) {
                if (uVar20 == 2) {
                  uVar20 = 7;
                }
                else {
                  uVar20 = 5;
                }
              }
            }
            else {
              bVar1 = 0;
              if ((uVar8 >> 0xe & 1) == 0) {
                uVar20 = 0;
              }
              else {
                uVar20 = 0;
                if ((uVar23 & 1) != 0) goto LAB_009e3279;
              }
            }
            if ((((uVar13 ^ uVar17) & 0xf0000000) == 0) &&
               (uVar22 = (uVar13 & 0x1ffc) << 0xf,
               !(bool)(bVar1 ^ 1) && (~uVar22 & uVar17 & 0xffe0000) == (uVar13 & 0xffe0000))) {
              ctx->raddr = (ulong)(uVar17 & (uVar22 | 0x1f000) |
                                  (uint)env->DBAT[uVar16 * 2 + 1][uVar18] & 0xfffe0000);
              ctx->prot = uVar20;
              uVar8 = 2 - (rw == 0);
              if (access_type == 0x10) {
                uVar8 = uVar21;
              }
              if ((uVar20 & uVar8) != 0) {
                return 0;
              }
              break;
            }
          }
        }
        ctx->eaddr = eaddr;
        uVar16 = env->sr[eaddr >> 0x1c];
        uVar8 = (uint)uVar16;
        if (((uVar8 >> 0x1d & 1) == 0) || ((local_60.PID >> 0xe & 1) == 0)) {
          local_38 = (uint)((local_60.PID >> 0xe & 1) == 0 & (byte)(uVar16 >> 0x1e) & 3);
        }
        else {
          local_38 = 1;
        }
        ctx->key = local_38;
        local_60.prot = (uint)(uVar16 >> 0x1c) & 1;
        uVar17 = uVar17 & 0xfffffff;
        local_60.PID = (target_ulong)(uVar17 >> 0x16 | (uVar8 & 0xffffff) << 7);
        ctx->nx = local_60.prot;
        ctx->ptem = local_60.PID;
        if ((int)uVar8 < 0) {
          uVar21 = (uint)env->sr[eaddr >> 0x1c];
          if ((uVar21 & 0x1ff00000) == 0x7f00000) {
            ctx->raddr = (ulong)(uVar21 << 0x1c | uVar17);
            ctx->prot = 7;
            return 0;
          }
          uVar21 = access_type << 0x1c | access_type - 0x10U >> 4;
          if (uVar21 == 1) {
            if (rw == 1) {
              if (local_38 == 0) {
                return -2;
              }
            }
            else if (local_38 != 0 || rw != 0) {
              return -2;
            }
            ctx->raddr = eaddr;
            return 2;
          }
          if (uVar21 != 5) {
            return -4;
          }
        }
        else {
          if ((access_type == 0x10) && ((uVar16 >> 0x1c & 1) != 0)) {
            return -3;
          }
          ctx->raddr = 0xffffffffffffffff;
          uVar16 = (ulong)(uVar8 & 0xffffff ^ uVar17 >> 0xc);
          local_60.size = eaddr & 0xfffffffffffff000;
          ctx->hash[0] = uVar16;
          ctx->hash[1] = ~uVar16;
          iVar7 = env->nb_ways;
          local_60.attr = 2 - (rw == 0);
          if (access_type == 0x10) {
            local_60.attr = uVar21;
          }
          iVar6 = 0;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          local_60.prot = local_60.prot << 2;
          iVar15 = -1;
          uVar16 = 0xffffffffffffffff;
          iVar14 = -1;
          for (; iVar7 != iVar6; iVar6 = iVar6 + 1) {
            iVar9 = ppc6xx_tlb_getnum(env,eaddr,iVar6,(uint)(access_type == 0x10));
            lVar10 = (long)iVar9;
            if (local_60.size == (env->tlb).tlb6[lVar10].EPN) {
              ppVar12 = (env->tlb).tlb6 + lVar10;
              uVar21 = (uint)ppVar12->pte0;
              if (((uVar21 & 0x80000040) == 0x80000000) &&
                 ((uVar21 & 0x7fffffbf) == (uint)local_60.PID)) {
                uVar18 = ppVar12->pte1;
                if ((uVar16 != 0xffffffffffffffff) &&
                   (((uVar16 ^ uVar18) & 0xfffffffffffff07b) != 0)) {
                  return -1;
                }
                if (local_38 == 0) {
                  uVar21 = (uint)((~(uint)uVar18 & 3) != 0) * 2 + 1;
                }
                else {
                  uVar21 = *(uint *)(&DAT_00bb8e98 + (ulong)((uint)uVar18 & 3) * 4);
                }
                uVar21 = (uVar21 | local_60.prot) ^ 4;
                ctx->raddr = uVar18;
                ctx->prot = uVar21;
                iVar15 = -2;
                uVar16 = uVar18;
                iVar14 = iVar9;
                if ((local_60.attr & uVar21) != 0) {
                  iVar15 = 0;
                  pmVar24 = ctx;
                  goto LAB_009e3a0b;
                }
              }
            }
          }
          if (iVar14 == -1) {
            return iVar15;
          }
          lVar10 = (long)iVar14;
          pmVar24 = ctx;
LAB_009e3a0b:
          ctx = (mmu_ctx_t_conflict *)&(env->tlb).tlb6[lVar10].pte1;
          uVar16 = *(ulong *)ctx;
          if (((uint)uVar16 >> 8 & 1) == 0) {
            uVar16 = uVar16 | 0x100;
            *(ulong *)ctx = uVar16;
          }
          if ((char)uVar16 < '\0') {
            return iVar15;
          }
          if (local_60.EPN._4_4_ != 1 || iVar15 != 0) {
            *(byte *)&pmVar24->prot = (byte)pmVar24->prot & 0xfd;
            return iVar15;
          }
          eaddr = uVar16 | 0x80;
        }
        ctx->raddr = eaddr;
        return 0;
      }
      break;
    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_SOFT_4xx_Z:
      if ((uVar8 & uVar17) != 0) {
        local_60.RPN = 0xffffffffffffffff;
        uVar17 = 2 - (rw == 0);
        if (access_type == 0x10) {
          uVar17 = uVar21;
        }
        uVar23 = 0;
        uVar18 = (ulong)(uint)env->nb_tlb;
        if (env->nb_tlb < 1) {
          uVar18 = uVar23;
        }
        iVar7 = -1;
        do {
          if (uVar18 * 0x28 - uVar23 == 0) {
            return iVar7;
          }
          ppVar2 = (env->tlb).tlbe;
          iVar6 = ppcemb_tlb_check((CPUPPCState_conflict2 *)((long)&ppVar2->RPN + uVar23),&local_60,
                                   (hwaddr *)eaddr,(ulong)(uint)env->spr[0x3b1],0,(int)uVar16,
                                   (int)ctx);
          if (-1 < iVar6) {
            switch((uint)(env->spr[0x3b0] >>
                         ((byte)~*(byte *)((long)&ppVar2->attr + uVar23) >> 3 & 0x1e)) & 3) {
            case 0:
              if (((uint)local_60.PID >> 0xe & 1) == 0) break;
              env->spr[0x3d4] = 0x400000;
              ctx->prot = 0;
              goto LAB_009e33bc;
            case 2:
              if (((uint)local_60.PID >> 0xe & 1) == 0) goto switchD_009e3375_caseD_3;
              break;
            case 3:
switchD_009e3375_caseD_3:
              ctx->prot = 7;
LAB_009e3733:
              ctx->raddr = local_60.RPN;
              return 0;
            }
            uVar21 = *(uint *)((long)&ppVar2->prot + uVar23);
            ctx->prot = uVar21;
            if ((uVar21 & uVar17) != 0) goto LAB_009e3733;
            env->spr[0x3d4] = 0;
LAB_009e33bc:
            iVar7 = -2;
          }
          uVar23 = uVar23 + 0x28;
        } while( true );
      }
      break;
    case POWERPC_MMU_REAL:
      if ((uVar8 & uVar17) != 0) {
        fmt = "PowerPC in real mode do not do any translation\n";
        goto LAB_009e3ab8;
      }
      break;
    case POWERPC_MMU_MPC8xx:
      fmt = "MPC8xx MMU model is not implemented\n";
      goto LAB_009e3ab8;
    case POWERPC_MMU_BOOKE:
      local_60.RPN = 0xffffffffffffffff;
      uVar23 = 0;
      uVar18 = (ulong)(uint)env->nb_tlb;
      if (env->nb_tlb < 1) {
        uVar18 = uVar23;
      }
      local_60.size = (target_ulong)((uint)(local_60.PID >> 4) & 1);
      uVar3 = local_60.PID >> 5;
      do {
        if (uVar18 * 0x28 - uVar23 == 0) {
          return -1;
        }
        ppVar2 = (env->tlb).tlbe;
        env_00 = (CPUPPCState_conflict2 *)((long)&ppVar2->RPN + uVar23);
        iVar7 = ppcemb_tlb_check(env_00,&local_60,(hwaddr *)eaddr,(ulong)(uint)env->spr[0x30],
                                 (uint)(env->nb_pids == 0),(int)uVar16,(int)ctx);
        if (((-1 < iVar7) ||
            ((env->spr[0x279] != 0 &&
             (iVar7 = ppcemb_tlb_check(env_00,&local_60,(hwaddr *)eaddr,env->spr[0x279],0,
                                       (int)uVar16,(int)ctx), -1 < iVar7)))) ||
           ((env->spr[0x27a] != 0 &&
            (iVar7 = ppcemb_tlb_check(env_00,&local_60,(hwaddr *)eaddr,env->spr[0x27a],0,(int)uVar16
                                      ,(int)ctx), -1 < iVar7)))) {
          uVar17 = *(uint *)((long)&ppVar2->prot + uVar23);
          uVar21 = *(uint *)((long)&ppVar2->attr + uVar23) & 1;
          if (access_type == 0x10) {
            if (((uint)uVar3 & 1) == uVar21) {
              uVar21 = uVar17 >> 4;
              if (((uint)local_60.PID >> 0xe & 1) != 0) {
                uVar21 = uVar17;
              }
              ctx->prot = uVar21 & 0xf;
              uVar21 = uVar21 & 4;
joined_r0x009e36be:
              if (uVar21 == 0) {
                return -3;
              }
              goto LAB_009e3733;
            }
          }
          else if ((uint)local_60.size == uVar21) {
            uVar8 = uVar17 >> 4;
            if (((uint)local_60.PID >> 0xe & 1) != 0) {
              uVar8 = uVar17;
            }
            ctx->prot = uVar8 & 0xf;
            if ((local_60.EPN._4_4_ != 0) || ((uVar8 & 1) == 0)) {
              if (local_60.EPN._4_4_ == 0) {
                return -2;
              }
              uVar8 = uVar8 & 2;
joined_r0x009e36a3:
              if (uVar8 == 0) {
                return -2;
              }
            }
            goto LAB_009e3733;
          }
        }
        uVar23 = uVar23 + 0x28;
      } while( true );
    case POWERPC_MMU_BOOKE206:
      local_60.RPN = 0xffffffffffffffff;
      local_60.PID = (target_ulong)(uVar8 >> 5 & 1);
      lVar10 = 0;
      do {
        if (lVar10 == 4) {
          return -1;
        }
        bVar1 = *(byte *)((long)env->spr + lVar10 * 8 + 0x1583);
        for (uVar21 = 0; bVar1 != uVar21; uVar21 = uVar21 + 1) {
          tlb = booke206_get_tlbm(env,(int)lVar10,eaddr,uVar21);
          if (tlb != (ppcmas_tlb_t *)0x0) {
            _Var5 = mmubooke206_get_as(env,(uint)local_60.size,&epid,&as,&local_62);
            if (_Var5) {
              tVar19 = (target_ulong)epid;
LAB_009e357b:
              iVar7 = ppcmas_tlb_check(env,tlb,&local_60.RPN,eaddr,(uint32_t)tVar19);
              if (iVar7 < 0) goto LAB_009e360f;
            }
            else {
              iVar7 = ppcmas_tlb_check(env,tlb,&local_60.RPN,eaddr,(uint32_t)env->spr[0x30]);
              if ((iVar7 < 0) &&
                 ((env->spr[0x279] == 0 ||
                  (iVar7 = ppcmas_tlb_check(env,tlb,&local_60.RPN,eaddr,(uint32_t)env->spr[0x279]),
                  iVar7 < 0)))) {
                tVar19 = env->spr[0x27a];
                if (tVar19 == 0) goto LAB_009e360f;
                goto LAB_009e357b;
              }
            }
            uVar17 = (uint)tlb->mas7_3;
            if (local_62 == true) {
              uVar8 = uVar17 >> 2 & 2 | uVar17 >> 1 & 1;
              sVar4 = 3;
            }
            else {
              uVar8 = uVar17 >> 1 & 2 | uVar17 & 1;
              sVar4 = 2;
            }
            if (access_type == 0x10) {
              if (_Var5) {
                __assert_fail("!use_epid",
                              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu_helper.c"
                              ,0x432,
                              "int mmubooke206_check_tlb(CPUPPCState *, ppcmas_tlb_t *, hwaddr *, int *, target_ulong, int, int, int)"
                             );
              }
              if ((uint)local_60.PID == (uint)((tlb->mas1 >> 0xc & 1) != 0)) {
                uVar21 = uVar17 >> sVar4 & 4;
                ctx->prot = uVar8 | uVar21;
                goto joined_r0x009e36be;
              }
            }
            else if ((tlb->mas1 >> 0xc & 1) == (uint)as) {
              ctx->prot = uVar17 >> sVar4 & 4 | uVar8;
              if ((local_60.EPN._4_4_ == 0) && ((uVar8 & 1) != 0)) goto LAB_009e3733;
              if (local_60.EPN._4_4_ == 0) {
                return -2;
              }
              uVar8 = uVar8 & 0xfffffffe;
              goto joined_r0x009e36a3;
            }
          }
LAB_009e360f:
        }
        lVar10 = lVar10 + 1;
      } while( true );
    }
    iVar7 = check_physical(env,ctx,eaddr,rw);
    return iVar7;
  }
  fmt = "Unknown or invalid MMU model\n";
LAB_009e3ab8:
  cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,fmt,puVar11,lVar10);
}

Assistant:

static int get_physical_address_wtlb(
    CPUPPCState *env, mmu_ctx_t *ctx,
    target_ulong eaddr, int rw, int access_type,
    int mmu_idx)
{
    int ret = -1;
    bool real_mode = (access_type == ACCESS_CODE && msr_ir == 0)
        || (access_type != ACCESS_CODE && msr_dr == 0);

    switch (env->mmu_model) {
    case POWERPC_MMU_SOFT_6xx:
    case POWERPC_MMU_SOFT_74xx:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            /* Try to find a BAT */
            if (env->nb_BATs != 0) {
                ret = get_bat_6xx_tlb(env, ctx, eaddr, rw, access_type);
            }
            if (ret < 0) {
                /* We didn't match any BAT entry or don't have BATs */
                ret = get_segment_6xx_tlb(env, ctx, eaddr, rw, access_type);
            }
        }
        break;

    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_SOFT_4xx_Z:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            ret = mmu40x_get_physical_address(env, ctx, eaddr,
                                              rw, access_type);
        }
        break;
    case POWERPC_MMU_BOOKE:
        ret = mmubooke_get_physical_address(env, ctx, eaddr,
                                            rw, access_type);
        break;
    case POWERPC_MMU_BOOKE206:
        ret = mmubooke206_get_physical_address(env, ctx, eaddr, rw,
                                               access_type, mmu_idx);
        break;
    case POWERPC_MMU_MPC8xx:
        /* XXX: TODO */
        cpu_abort(env_cpu(env), "MPC8xx MMU model is not implemented\n");
        break;
    case POWERPC_MMU_REAL:
        if (real_mode) {
            ret = check_physical(env, ctx, eaddr, rw);
        } else {
            cpu_abort(env_cpu(env),
                      "PowerPC in real mode do not do any translation\n");
            return -1;
        }
        break;
    default:
        cpu_abort(env_cpu(env), "Unknown or invalid MMU model\n");
        return -1;
    }

    return ret;
}